

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

inetwork * create_network(void)

{
  uint uVar1;
  network *instance;
  
  instance = (network *)operator_new(0x48);
  network::network(instance);
  uVar1 = (*(instance->super_inetwork)._vptr_inetwork[7])();
  if ((uVar1 & 1) == 0) {
    (*(instance->super_inetwork)._vptr_inetwork[6])();
    instance = (network *)0x0;
  }
  return &instance->super_inetwork;
}

Assistant:

inetwork* create_network()
{
    network* instance = new network();
    if (!instance->init())
    {
        instance->release();
        return NULL;
    }
    return instance;
}